

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

void do_cmd_explore(command *cmd)

{
  loc grid;
  player_upkeep *ppVar1;
  loc start;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  loc lVar5;
  square *psVar6;
  monster *mon;
  wchar_t y;
  int y_00;
  wchar_t x;
  int x_00;
  char *fmt;
  
  if (player->timed[4] == 0) {
    lVar5.x = (player->grid).x;
    lVar5.y = (player->grid).y;
    _Var3 = square_iswebbed(cave,lVar5);
    if (_Var3) {
      msg("You clear the web.");
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      square_destroy_trap(cave,grid);
      player->upkeep->energy_use = (uint)z_info->move_energy;
      return;
    }
    y_00 = 0;
    bVar2 = false;
    while ((y_00 < cave->height && (!bVar2))) {
      for (x_00 = 0; bVar2 = x_00 < cave->width, x_00 < cave->width; x_00 = x_00 + 1) {
        lVar5 = (loc)loc(x_00,y_00);
        _Var3 = loc_eq((loc_conflict)lVar5,player->grid);
        if (!_Var3) {
          _Var3 = square_isoccupied(cave,lVar5);
          if (_Var3) {
            psVar6 = square(cave,lVar5);
            mon = cave_monster(cave,(int)psVar6->mon);
            _Var3 = monster_is_obvious(mon);
            if (_Var3) break;
          }
        }
      }
      y_00 = y_00 + 1;
    }
    if (bVar2) {
      fmt = "Something is here.";
    }
    else {
      ppVar1 = player->upkeep;
      if (ppVar1->steps != (int16_t *)0x0) {
        __assert_fail("!player->upkeep->steps",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                      ,0x61d,"void do_cmd_explore(struct command *)");
      }
      start.x = (player->grid).x;
      start.y = (player->grid).y;
      wVar4 = path_nearest_unknown(player,start,(loc *)&ppVar1->path_dest,&ppVar1->steps);
      ppVar1 = player->upkeep;
      ppVar1->step_count = wVar4;
      if (L'\0' < wVar4) {
        ppVar1->running = wVar4;
        *(byte *)&ppVar1->update = (byte)ppVar1->update | 2;
        run_step(L'\0');
        return;
      }
      fmt = "No apparent path for exploration.";
    }
  }
  else {
    fmt = "You cannot explore while confused.";
  }
  msg(fmt);
  return;
}

Assistant:

void do_cmd_explore(struct command *cmd)
{
	bool visible_monster = false;
	/* cancel if confused */
	if (player->timed[TMD_CONFUSED]) {
		msg("You cannot explore while confused.");
	   	return;
	}


	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		msg("You clear the web.");
		square_destroy_trap(cave, player->grid);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}
	

	/* Screen for visible monsters */
	for (int y = 0; y < cave->height && !visible_monster; y++) {
		for (int x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);
			
			if (loc_eq(grid, player->grid)) continue;

			if (square_isoccupied(cave, grid)) {
				int m_idx = square(cave, grid)->mon;
				struct monster *mon = cave_monster(cave, m_idx);
				if (monster_is_obvious(mon)) {
					visible_monster = true;
					break; /* only breaks the inner loop */
				}
			}
		}
	}

	if (visible_monster) {
		msg("Something is here.");
		return;
	}

	assert(!player->upkeep->steps);
	player->upkeep->step_count = path_nearest_unknown(player, player->grid,
		&player->upkeep->path_dest, &player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
		return;
	}

	msg("No apparent path for exploration.");
}